

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter.cpp
# Opt level: O2

bool ComputeFilter(BlockFilterType filter_type,CBlockIndex *block_index,BlockFilter *filter,
                  BlockManager *blockman)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  CBlockUndo block_undo;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  BlockFilter local_100;
  CBlock block;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock7,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/blockfilter.cpp"
             ,0x11,false);
  CBlock::CBlock(&block);
  local_100._0_8_ = CBlockIndex::GetBlockPos(block_index);
  bVar2 = node::BlockManager::ReadBlockFromDisk(blockman,&block,(FlatFilePos *)&local_100);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_006925a8;
  }
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  block_undo.vtxundo.super__Vector_base<CTxUndo,_std::allocator<CTxUndo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (block_index->nHeight < 1) {
LAB_00692566:
    BlockFilter::BlockFilter(&local_100,filter_type,&block,&block_undo);
    BlockFilter::operator=(filter,&local_100);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               &local_100.m_filter.m_encoded);
    bVar2 = true;
  }
  else {
    bVar2 = node::BlockManager::UndoReadFromDisk(blockman,&block_undo,block_index);
    if (bVar2) goto LAB_00692566;
    bVar2 = false;
  }
  std::vector<CTxUndo,_std::allocator<CTxUndo>_>::~vector(&block_undo.vtxundo);
LAB_006925a8:
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool ComputeFilter(BlockFilterType filter_type, const CBlockIndex& block_index, BlockFilter& filter, const BlockManager& blockman)
{
    LOCK(::cs_main);

    CBlock block;
    if (!blockman.ReadBlockFromDisk(block, block_index.GetBlockPos())) {
        return false;
    }

    CBlockUndo block_undo;
    if (block_index.nHeight > 0 && !blockman.UndoReadFromDisk(block_undo, block_index)) {
        return false;
    }

    filter = BlockFilter(filter_type, block, block_undo);
    return true;
}